

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

string * __thiscall
flatbuffers::rust::RustGenerator::GetTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Type *type)

{
  FullType FVar1;
  allocator<char> local_19;
  
  FVar1 = anon_unknown_26::GetFullType(type);
  if ((FVar1 < ftUnionValue) &&
     ((0x67U >> (FVar1 & (ftVectorOfUnionValue|ftVectorOfString)) & 1) != 0)) {
    if (type->enum_def == (EnumDef *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,GetTypeBasic::ctypename[type->base_type],&local_19
                );
    }
    else {
      WrapInNameSpace_abi_cxx11_(__return_storage_ptr__,this,&type->enum_def->super_Definition);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("false && \"incorrect type given\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x262,
                "std::string flatbuffers::rust::RustGenerator::GetTypeBasic(const Type &) const");
}

Assistant:

std::string GetTypeBasic(const Type &type) const {
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool:
      case ftEnumKey:
      case ftUnionKey: {
        break;
      }
      default: {
        FLATBUFFERS_ASSERT(false && "incorrect type given");
      }
    }

    // clang-format off
    static const char * const ctypename[] = {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, \
                           RTYPE, ...) \
      #RTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    };
    // clang-format on

    if (type.enum_def) { return WrapInNameSpace(*type.enum_def); }
    return ctypename[type.base_type];
  }